

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::LSTM_x86_avx512::forward
          (LSTM_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint reverse;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  int i;
  ulong uVar9;
  void *in_R8;
  void *__src;
  void *__dest;
  bool bVar10;
  Mat m;
  Mat m_5;
  Mat local_358;
  Mat local_308;
  Mat m_4;
  Mat local_268;
  Mat m_6;
  Mat m_2;
  Mat m_3;
  Mat m_1;
  Mat m_8;
  Mat m_9;
  
  if ((this->super_LSTM).int8_scale_term != 0) {
    iVar3 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar3;
  }
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar3 = (this->super_LSTM).direction;
  local_308.cstep = 0;
  local_308.data = (void *)0x0;
  local_308.refcount._0_4_ = 0;
  local_308.refcount._4_4_ = 0;
  local_308.elemsize._0_4_ = 0;
  local_308.elemsize._4_4_ = 0;
  local_308.elempack = 0;
  local_308.allocator = (Allocator *)0x0;
  local_308.dims = 0;
  local_308.w = 0;
  local_308.h = 0;
  local_308.d = 0;
  local_308.c = 0;
  local_358.cstep = 0;
  local_358.data = (void *)0x0;
  local_358.refcount._0_4_ = 0;
  local_358.refcount._4_4_ = 0;
  local_358.elemsize._0_4_ = 0;
  local_358.elemsize._4_4_ = 0;
  local_358.elempack = 0;
  local_358.allocator = (Allocator *)0x0;
  local_358.dims = 0;
  local_358.w = 0;
  local_358.h = 0;
  local_358.d = 0;
  local_358.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_308.allocator == (Allocator *)0x0) {
          if (local_308.data != (void *)0x0) {
            free(local_308.data);
          }
        }
        else {
          (*(local_308.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_308.data = m.data;
    local_308.refcount._0_4_ = m.refcount._0_4_;
    local_308.refcount._4_4_ = m.refcount._4_4_;
    local_308.elemsize._0_4_ = (undefined4)m.elemsize;
    local_308.elemsize._4_4_ = m.elemsize._4_4_;
    local_308.elempack = m.elempack;
    local_308.allocator = m.allocator;
    local_308.dims = m.dims;
    local_308.w = m.w;
    local_308.h = m.h;
    local_308.d = m.d;
    local_308.c = m.c;
    local_308.cstep = m.cstep;
    sVar6 = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
            sVar6 = m.cstep;
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
          sVar6 = m.cstep;
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar6,
               in_R8);
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_358.allocator == (Allocator *)0x0) {
          if (local_358.data != (void *)0x0) {
            free(local_358.data);
          }
        }
        else {
          (*(local_358.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_358.data = m.data;
    local_358.refcount._0_4_ = m.refcount._0_4_;
    local_358.refcount._4_4_ = m.refcount._4_4_;
    local_358.elemsize._0_4_ = (undefined4)m.elemsize;
    local_358.elemsize._4_4_ = m.elemsize._4_4_;
    local_358.elempack = m.elempack;
    local_358.allocator = m.allocator;
    local_358.dims = m.dims;
    local_358.w = m.w;
    local_358.h = m.h;
    local_358.d = m.d;
    local_358.c = m.c;
    local_358.cstep = m.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  else {
    iVar5 = (iVar3 == 2) + 1;
    Mat::create(&local_308,(this->super_LSTM).num_output,iVar5,4,_allocator);
    iVar4 = -100;
    if ((local_308.data == (void *)0x0) || ((long)local_308.c * local_308.cstep == 0))
    goto LAB_0038df97;
    if (0 < local_308.c * (int)local_308.cstep) {
      memset(local_308.data,0,(ulong)(uint)(local_308.c * (int)local_308.cstep) << 2);
    }
    Mat::create(&local_358,(this->super_LSTM).hidden_size,iVar5,4,_allocator);
    if ((local_358.data == (void *)0x0) || ((long)local_358.c * local_358.cstep == 0))
    goto LAB_0038df97;
    if (0 < local_358.c * (int)local_358.cstep) {
      memset(local_358.data,0,(ulong)(uint)(local_358.c * (int)local_358.cstep) << 2);
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_LSTM).num_output << (iVar3 == 2),_h,4,opt->blob_allocator);
  iVar3 = -100;
  iVar4 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    reverse = (this->super_LSTM).direction;
    if (reverse < 2) {
      m.w = (this->weight_xc_data_packed).w;
      m.h = (this->weight_xc_data_packed).h;
      m.c = (this->weight_xc_data_packed).d;
      m.data = (this->weight_xc_data_packed).data;
      uVar9 = (this->weight_xc_data_packed).elemsize;
      m.elempack = (this->weight_xc_data_packed).elempack;
      m.allocator = (this->weight_xc_data_packed).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar9;
      m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      m.d = 1;
      iVar3 = (this->weight_xc_data_packed).dims;
      m.dims = iVar3 + -1;
      m.cstep = (uVar9 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar9;
      if (iVar3 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data_packed).w;
      m_1.h = (this->bias_c_data_packed).h;
      m_1.c = (this->bias_c_data_packed).d;
      m_1.data = (this->bias_c_data_packed).data;
      uVar9 = (this->bias_c_data_packed).elemsize;
      m_1.elempack = (this->bias_c_data_packed).elempack;
      m_1.allocator = (this->bias_c_data_packed).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar9;
      m_1.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      m_1.d = 1;
      iVar3 = (this->bias_c_data_packed).dims;
      m_1.dims = iVar3 + -1;
      m_1.cstep = (uVar9 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar9;
      if (iVar3 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data_packed).w;
      m_2.h = (this->weight_hc_data_packed).h;
      m_2.c = (this->weight_hc_data_packed).d;
      m_2.data = (this->weight_hc_data_packed).data;
      uVar9 = (this->weight_hc_data_packed).elemsize;
      m_2.elempack = (this->weight_hc_data_packed).elempack;
      m_2.allocator = (this->weight_hc_data_packed).allocator;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)uVar9;
      m_2.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      m_2.d = 1;
      sVar6 = (long)m_2.h * (long)m_2.w;
      iVar3 = (this->weight_hc_data_packed).dims;
      m_2.dims = iVar3 + -1;
      m_2.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
      if (iVar3 == 4) {
        m_2.cstep = sVar6;
      }
      if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->super_LSTM).weight_hr_data.w;
        m_3.h = (this->super_LSTM).weight_hr_data.h;
        m_3.c = (this->super_LSTM).weight_hr_data.d;
        m_3.data = (this->super_LSTM).weight_hr_data.data;
        uVar9 = (this->super_LSTM).weight_hr_data.elemsize;
        m_3.elempack = (this->super_LSTM).weight_hr_data.elempack;
        m_3.allocator = (this->super_LSTM).weight_hr_data.allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar9;
        m_3.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
        m_3.d = 1;
        iVar3 = (this->super_LSTM).weight_hr_data.dims;
        m_3.dims = iVar3 + -1;
        m_3.cstep = (uVar9 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar9;
        if (iVar3 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar3 = lstm(bottom_blob,this_00,reverse,&m,&m_1,&m_2,&m_3,&local_308,&local_358,opt);
      piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_3.allocator == (Allocator *)0x0) {
            if (m_3.data != (void *)0x0) {
              free(m_3.data);
            }
          }
          else {
            (*(m_3.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar2 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
            if (m_2.data != (void *)0x0) {
              free(m_2.data);
            }
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_2.cstep = 0;
      m_2.data = (void *)0x0;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = 0;
      m_2.elemsize._4_4_ = 0;
      m_2.elempack = 0;
      m_2.dims = 0;
      m_2.w = 0;
      m_2.h = 0;
      m_2.d = 0;
      m_2.c = 0;
      piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      iVar4 = iVar3;
      if (iVar3 != 0) goto LAB_0038df97;
    }
    if ((this->super_LSTM).direction == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,(this->super_LSTM).num_output,_h,4,opt->workspace_allocator);
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar10 = false;
        iVar4 = -100;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,(this->super_LSTM).num_output,_h,4,opt->workspace_allocator);
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar10 = false;
          iVar4 = -100;
        }
        else {
          m_2.cstep = (size_t)local_308.w;
          m_2.data = local_308.data;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = (undefined4)local_308.elemsize;
          m_2.elemsize._4_4_ = local_308.elemsize._4_4_;
          m_2.elempack = local_308.elempack;
          m_2.allocator = local_308.allocator;
          m_2.w = local_308.w;
          m_2.dims = 2;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          m_3.cstep = (size_t)local_358.w;
          m_3.data = local_358.data;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_358.elemsize;
          m_3.elemsize._4_4_ = local_358.elemsize._4_4_;
          m_3.elempack = local_358.elempack;
          m_3.allocator = local_358.allocator;
          m_3.dims = 2;
          m_3.w = local_358.w;
          m_3.h = 1;
          m_3.d = 1;
          m_3.c = 1;
          local_268.w = (this->weight_xc_data_packed).w;
          local_268.h = (this->weight_xc_data_packed).h;
          local_268.c = (this->weight_xc_data_packed).d;
          local_268.data = (this->weight_xc_data_packed).data;
          uVar9 = (this->weight_xc_data_packed).elemsize;
          local_268.elempack = (this->weight_xc_data_packed).elempack;
          local_268.allocator = (this->weight_xc_data_packed).allocator;
          local_268.refcount._0_4_ = 0;
          local_268.refcount._4_4_ = 0;
          local_268.elemsize._0_4_ = (undefined4)uVar9;
          local_268.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          local_268.d = 1;
          uVar7 = (long)local_268.h * (long)local_268.w;
          iVar4 = (this->weight_xc_data_packed).dims;
          local_268.dims = iVar4 + -1;
          local_268.cstep = (uVar9 * uVar7 + 0xf & 0xfffffffffffffff0) / uVar9;
          if (iVar4 == 4) {
            local_268.cstep = uVar7;
          }
          m_4.w = (this->bias_c_data_packed).w;
          m_4.h = (this->bias_c_data_packed).h;
          m_4.c = (this->bias_c_data_packed).d;
          m_4.data = (this->bias_c_data_packed).data;
          uVar9 = (this->bias_c_data_packed).elemsize;
          m_4.elempack = (this->bias_c_data_packed).elempack;
          m_4.allocator = (this->bias_c_data_packed).allocator;
          m_4.refcount._0_4_ = 0;
          m_4.refcount._4_4_ = 0;
          m_4.elemsize._0_4_ = (undefined4)uVar9;
          m_4.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          m_4.d = 1;
          sVar6 = (long)m_4.h * (long)m_4.w;
          iVar4 = (this->bias_c_data_packed).dims;
          m_4.dims = iVar4 + -1;
          m_4.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
          if (iVar4 == 4) {
            m_4.cstep = sVar6;
          }
          m_5.w = (this->weight_hc_data_packed).w;
          m_5.h = (this->weight_hc_data_packed).h;
          m_5.c = (this->weight_hc_data_packed).d;
          m_5.data = (this->weight_hc_data_packed).data;
          uVar9 = (this->weight_hc_data_packed).elemsize;
          m_5.elempack = (this->weight_hc_data_packed).elempack;
          m_5.allocator = (this->weight_hc_data_packed).allocator;
          m_5.refcount._0_4_ = 0;
          m_5.refcount._4_4_ = 0;
          m_5.elemsize._0_4_ = (undefined4)uVar9;
          m_5.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
          m_5.d = 1;
          sVar6 = (long)m_5.h * (long)m_5.w;
          iVar4 = (this->weight_hc_data_packed).dims;
          m_5.dims = iVar4 + -1;
          m_5.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
          if (iVar4 == 4) {
            m_5.cstep = sVar6;
          }
          if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.allocator = (Allocator *)0x0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
          }
          else {
            m_6.w = (this->super_LSTM).weight_hr_data.w;
            m_6.h = (this->super_LSTM).weight_hr_data.h;
            m_6.c = (this->super_LSTM).weight_hr_data.d;
            m_6.data = (this->super_LSTM).weight_hr_data.data;
            uVar9 = (this->super_LSTM).weight_hr_data.elemsize;
            m_6.elempack = (this->super_LSTM).weight_hr_data.elempack;
            m_6.allocator = (this->super_LSTM).weight_hr_data.allocator;
            m_6.elemsize._0_4_ = (undefined4)uVar9;
            m_6.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
            m_6.d = 1;
            iVar4 = (this->super_LSTM).weight_hr_data.dims;
            m_6.dims = iVar4 + -1;
            m_6.cstep = (uVar9 * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) / uVar9;
            if (iVar4 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
          }
          m_6.refcount._4_4_ = 0;
          m_6.refcount._0_4_ = 0;
          iVar4 = lstm(bottom_blob,&m,0,&local_268,&m_4,&m_5,&m_6,&m_2,&m_3,opt);
          piVar2 = (int *)CONCAT44(m_6.refcount._4_4_,m_6.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_6.allocator == (Allocator *)0x0) {
                if (m_6.data != (void *)0x0) {
                  free(m_6.data);
                }
              }
              else {
                (*(m_6.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar2 = (int *)CONCAT44(m_5.refcount._4_4_,m_5.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_5.allocator == (Allocator *)0x0) {
                if (m_5.data != (void *)0x0) {
                  free(m_5.data);
                }
              }
              else {
                (*(m_5.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_5.cstep = 0;
          m_5.data = (void *)0x0;
          m_5.refcount._0_4_ = 0;
          m_5.refcount._4_4_ = 0;
          m_5.elemsize._0_4_ = 0;
          m_5.elemsize._4_4_ = 0;
          m_5.elempack = 0;
          m_5.dims = 0;
          m_5.w = 0;
          m_5.h = 0;
          m_5.d = 0;
          m_5.c = 0;
          piVar2 = (int *)CONCAT44(m_4.refcount._4_4_,m_4.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_4.allocator == (Allocator *)0x0) {
                if (m_4.data != (void *)0x0) {
                  free(m_4.data);
                }
              }
              else {
                (*(m_4.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_4.cstep = 0;
          m_4.data = (void *)0x0;
          m_4.refcount._0_4_ = 0;
          m_4.refcount._4_4_ = 0;
          m_4.elemsize._0_4_ = 0;
          m_4.elemsize._4_4_ = 0;
          m_4.elempack = 0;
          m_4.dims = 0;
          m_4.w = 0;
          m_4.h = 0;
          m_4.d = 0;
          m_4.c = 0;
          piVar2 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (local_268.allocator == (Allocator *)0x0) {
                if (local_268.data != (void *)0x0) {
                  free(local_268.data);
                }
              }
              else {
                (*(local_268.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (iVar4 == 0) {
            local_268.cstep = (size_t)local_308.w;
            local_268.data =
                 (void *)(CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize) *
                          local_268.cstep + (long)local_308.data);
            local_268.refcount._0_4_ = 0;
            local_268.refcount._4_4_ = 0;
            local_268.elemsize._0_4_ = (undefined4)local_308.elemsize;
            local_268.elemsize._4_4_ = local_308.elemsize._4_4_;
            local_268.elempack = local_308.elempack;
            local_268.allocator = local_308.allocator;
            local_268.w = local_308.w;
            local_268.dims = 2;
            local_268.h = 1;
            local_268.d = 1;
            local_268.c = 1;
            m_4.cstep = (size_t)local_358.w;
            m_4.data = (void *)(CONCAT44(local_358.elemsize._4_4_,(undefined4)local_358.elemsize) *
                                m_4.cstep + (long)local_358.data);
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = (undefined4)local_358.elemsize;
            m_4.elemsize._4_4_ = local_358.elemsize._4_4_;
            m_4.elempack = local_358.elempack;
            m_4.allocator = local_358.allocator;
            m_4.w = local_358.w;
            m_4.dims = 2;
            m_4.h = 1;
            m_4.d = 1;
            m_4.c = 1;
            m_5.w = (this->weight_xc_data_packed).w;
            m_5.h = (this->weight_xc_data_packed).h;
            m_5.c = (this->weight_xc_data_packed).d;
            uVar9 = (this->weight_xc_data_packed).elemsize;
            m_5.data = (void *)((this->weight_xc_data_packed).cstep * uVar9 +
                               (long)(this->weight_xc_data_packed).data);
            m_5.elempack = (this->weight_xc_data_packed).elempack;
            m_5.allocator = (this->weight_xc_data_packed).allocator;
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = (undefined4)uVar9;
            m_5.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
            m_5.d = 1;
            sVar6 = (long)m_5.h * (long)m_5.w;
            iVar4 = (this->weight_xc_data_packed).dims;
            m_5.dims = iVar4 + -1;
            m_5.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
            if (iVar4 == 4) {
              m_5.cstep = sVar6;
            }
            m_6.w = (this->bias_c_data_packed).w;
            m_6.h = (this->bias_c_data_packed).h;
            m_6.c = (this->bias_c_data_packed).d;
            uVar9 = (this->bias_c_data_packed).elemsize;
            m_6.data = (void *)((this->bias_c_data_packed).cstep * uVar9 +
                               (long)(this->bias_c_data_packed).data);
            m_6.elempack = (this->bias_c_data_packed).elempack;
            m_6.allocator = (this->bias_c_data_packed).allocator;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = (undefined4)uVar9;
            m_6.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
            m_6.d = 1;
            iVar4 = (this->bias_c_data_packed).dims;
            m_6.dims = iVar4 + -1;
            m_6.cstep = (uVar9 * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) / uVar9;
            if (iVar4 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            m_8.w = (this->weight_hc_data_packed).w;
            m_8.h = (this->weight_hc_data_packed).h;
            m_8.c = (this->weight_hc_data_packed).d;
            uVar9 = (this->weight_hc_data_packed).elemsize;
            m_8.data = (void *)((this->weight_hc_data_packed).cstep * uVar9 +
                               (long)(this->weight_hc_data_packed).data);
            m_8.elempack = (this->weight_hc_data_packed).elempack;
            m_8.allocator = (this->weight_hc_data_packed).allocator;
            m_8.refcount._0_4_ = 0;
            m_8.refcount._4_4_ = 0;
            m_8.elemsize._0_4_ = (undefined4)uVar9;
            m_8.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
            m_8.d = 1;
            sVar6 = (long)m_8.h * (long)m_8.w;
            iVar4 = (this->weight_hc_data_packed).dims;
            m_8.dims = iVar4 + -1;
            m_8.cstep = (uVar9 * sVar6 + 0xf & 0xfffffffffffffff0) / uVar9;
            if (iVar4 == 4) {
              m_8.cstep = sVar6;
            }
            if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
              m_9.cstep = 0;
              m_9.data = (void *)0x0;
              m_9.elemsize._0_4_ = 0;
              m_9.elemsize._4_4_ = 0;
              m_9.elempack = 0;
              m_9.allocator = (Allocator *)0x0;
              m_9.dims = 0;
              m_9.w = 0;
              m_9.h = 0;
              m_9.d = 0;
              m_9.c = 0;
            }
            else {
              m_9.w = (this->super_LSTM).weight_hr_data.w;
              m_9.h = (this->super_LSTM).weight_hr_data.h;
              uVar9 = (this->super_LSTM).weight_hr_data.elemsize;
              m_9.data = (void *)((this->super_LSTM).weight_hr_data.cstep * uVar9 +
                                 (long)(this->super_LSTM).weight_hr_data.data);
              m_9.elempack = (this->super_LSTM).weight_hr_data.elempack;
              m_9.allocator = (this->super_LSTM).weight_hr_data.allocator;
              m_9.elemsize._0_4_ = (undefined4)uVar9;
              m_9.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
              m_9.c = (this->super_LSTM).weight_hr_data.d;
              m_9.d = 1;
              iVar4 = (this->super_LSTM).weight_hr_data.dims;
              m_9.dims = iVar4 + -1;
              m_9.cstep = (uVar9 * (long)m_9.h * (long)m_9.w + 0xf & 0xfffffffffffffff0) / uVar9;
              if (iVar4 == 4) {
                m_9.cstep = (long)m_9.h * (long)m_9.w;
              }
            }
            m_9.refcount._4_4_ = 0;
            m_9.refcount._0_4_ = 0;
            iVar5 = lstm(bottom_blob,&m_1,1,&m_5,&m_6,&m_8,&m_9,&local_268,&m_4,opt);
            piVar2 = (int *)CONCAT44(m_9.refcount._4_4_,m_9.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_9.allocator == (Allocator *)0x0) {
                  if (m_9.data != (void *)0x0) {
                    free(m_9.data);
                  }
                }
                else {
                  (*(m_9.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar2 = (int *)CONCAT44(m_8.refcount._4_4_,m_8.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_8.allocator == (Allocator *)0x0) {
                  if (m_8.data != (void *)0x0) {
                    free(m_8.data);
                  }
                }
                else {
                  (*(m_8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_8.cstep = 0;
            m_8.data = (void *)0x0;
            m_8.refcount._0_4_ = 0;
            m_8.refcount._4_4_ = 0;
            m_8.elemsize._0_4_ = 0;
            m_8.elemsize._4_4_ = 0;
            m_8.elempack = 0;
            m_8.dims = 0;
            m_8.w = 0;
            m_8.h = 0;
            m_8.d = 0;
            m_8.c = 0;
            piVar2 = (int *)CONCAT44(m_6.refcount._4_4_,m_6.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_6.allocator == (Allocator *)0x0) {
                  if (m_6.data != (void *)0x0) {
                    free(m_6.data);
                  }
                }
                else {
                  (*(m_6.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
            piVar2 = (int *)CONCAT44(m_5.refcount._4_4_,m_5.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_5.allocator == (Allocator *)0x0) {
                  if (m_5.data != (void *)0x0) {
                    free(m_5.data);
                  }
                }
                else {
                  (*(m_5.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_5.cstep = 0;
            m_5.data = (void *)0x0;
            m_5.refcount._0_4_ = 0;
            m_5.refcount._4_4_ = 0;
            m_5.elemsize._0_4_ = 0;
            m_5.elemsize._4_4_ = 0;
            m_5.elempack = 0;
            m_5.dims = 0;
            m_5.w = 0;
            m_5.h = 0;
            m_5.d = 0;
            m_5.c = 0;
            bVar10 = iVar5 == 0;
            iVar4 = iVar3;
            if (!bVar10) {
              iVar4 = iVar5;
            }
            if (0 < (int)_h && bVar10) {
              uVar9 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar9 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar9 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)m.w * uVar9 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)(this->super_LSTM).num_output << 2);
                lVar8 = (long)(this->super_LSTM).num_output;
                memcpy((void *)(lVar8 * 4 + (long)__dest),__src,lVar8 << 2);
                uVar9 = uVar9 + 1;
              } while (_h != uVar9);
            }
            piVar2 = (int *)CONCAT44(m_4.refcount._4_4_,m_4.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (m_4.allocator == (Allocator *)0x0) {
                  if (m_4.data != (void *)0x0) {
                    free(m_4.data);
                  }
                }
                else {
                  (*(m_4.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            m_4.cstep = 0;
            m_4.data = (void *)0x0;
            m_4.refcount._0_4_ = 0;
            m_4.refcount._4_4_ = 0;
            m_4.elemsize._0_4_ = 0;
            m_4.elemsize._4_4_ = 0;
            m_4.elempack = 0;
            m_4.dims = 0;
            m_4.w = 0;
            m_4.h = 0;
            m_4.d = 0;
            m_4.c = 0;
            piVar2 = (int *)CONCAT44(local_268.refcount._4_4_,local_268.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_268.allocator == (Allocator *)0x0) {
                  if (local_268.data != (void *)0x0) {
                    free(local_268.data);
                  }
                }
                else {
                  (*(local_268.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar10 = false;
          }
          local_268.cstep = 0;
          local_268.c = 0;
          local_268.h = 0;
          local_268.d = 0;
          local_268.dims = 0;
          local_268.w = 0;
          local_268.elempack = 0;
          local_268.elemsize._4_4_ = 0;
          local_268.elemsize._0_4_ = 0;
          local_268.refcount._4_4_ = 0;
          local_268.refcount._0_4_ = 0;
          local_268.data = (void *)0x0;
          piVar2 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          piVar2 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_2.cstep = 0;
          m_2.data = (void *)0x0;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = 0;
          m_2.elemsize._4_4_ = 0;
          m_2.elempack = 0;
          m_2.dims = 0;
          m_2.w = 0;
          m_2.h = 0;
          m_2.d = 0;
          m_2.c = 0;
        }
        piVar2 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
      }
      piVar2 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      if (!bVar10) goto LAB_0038df97;
    }
    pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 0;
    if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar1 == 0xd8) {
      if (pMVar1 + 1 != &local_308) {
        piVar2 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar1[1].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar1[1].allocator == (Allocator *)0x0) {
              if (pMVar1[1].data != (void *)0x0) {
                free(pMVar1[1].data);
              }
            }
            else {
              (*(pMVar1[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar1[1].cstep = 0;
        *(undefined8 *)((long)&pMVar1[1].refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar1[1].elemsize + 4) = 0;
        pMVar1[1].data = (void *)0x0;
        pMVar1[1].refcount = (int *)0x0;
        pMVar1[1].dims = 0;
        pMVar1[1].w = 0;
        pMVar1[1].h = 0;
        pMVar1[1].d = 0;
        pMVar1[1].c = 0;
        pMVar1[1].data = local_308.data;
        pMVar1[1].refcount = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
        pMVar1[1].elemsize = CONCAT44(local_308.elemsize._4_4_,(undefined4)local_308.elemsize);
        pMVar1[1].elempack = local_308.elempack;
        pMVar1[1].allocator = local_308.allocator;
        pMVar1[1].dims = local_308.dims;
        pMVar1[1].w = local_308.w;
        pMVar1[1].h = local_308.h;
        pMVar1[1].d = local_308.d;
        pMVar1[1].c = local_308.c;
        pMVar1[1].cstep = local_308.cstep;
      }
      pMVar1 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = 0;
      if (pMVar1 + 2 != &local_358) {
        piVar2 = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar1[2].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar1[2].allocator == (Allocator *)0x0) {
              if (pMVar1[2].data != (void *)0x0) {
                free(pMVar1[2].data);
              }
            }
            else {
              (*(pMVar1[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar1[2].cstep = 0;
        *(undefined8 *)((long)&pMVar1[2].refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar1[2].elemsize + 4) = 0;
        pMVar1[2].data = (void *)0x0;
        pMVar1[2].refcount = (int *)0x0;
        pMVar1[2].dims = 0;
        pMVar1[2].w = 0;
        pMVar1[2].h = 0;
        pMVar1[2].d = 0;
        pMVar1[2].c = 0;
        pMVar1[2].data = local_358.data;
        pMVar1[2].refcount = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
        pMVar1[2].elemsize = CONCAT44(local_358.elemsize._4_4_,(undefined4)local_358.elemsize);
        pMVar1[2].elempack = local_358.elempack;
        pMVar1[2].allocator = local_358.allocator;
        pMVar1[2].dims = local_358.dims;
        pMVar1[2].w = local_358.w;
        pMVar1[2].h = local_358.h;
        pMVar1[2].d = local_358.d;
        pMVar1[2].c = local_358.c;
        pMVar1[2].cstep = local_358.cstep;
      }
    }
  }
LAB_0038df97:
  piVar2 = (int *)CONCAT44(local_358.refcount._4_4_,local_358.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_358.allocator == (Allocator *)0x0) {
        if (local_358.data != (void *)0x0) {
          free(local_358.data);
        }
      }
      else {
        (*(local_358.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_358.cstep = 0;
  local_358.data = (void *)0x0;
  local_358.refcount._0_4_ = 0;
  local_358.refcount._4_4_ = 0;
  local_358.elemsize._0_4_ = 0;
  local_358.elemsize._4_4_ = 0;
  local_358.elempack = 0;
  local_358.dims = 0;
  local_358.w = 0;
  local_358.h = 0;
  local_358.d = 0;
  local_358.c = 0;
  piVar2 = (int *)CONCAT44(local_308.refcount._4_4_,local_308.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_308.allocator == (Allocator *)0x0) {
        if (local_308.data != (void *)0x0) {
          free(local_308.data);
        }
      }
      else {
        (*(local_308.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data_packed.channel(1), bias_c_data_packed.channel(1), weight_hc_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}